

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_stats.hpp
# Opt level: O3

void __thiscall duckdb::StringStatisticsState::Update(StringStatisticsState *this,string_t *val)

{
  uint uVar1;
  char (*pacVar2) [4];
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  anon_union_16_2_67f50693_for_value local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  if (this->failed_truncate != false) {
    return;
  }
  if (this->has_stats == true) {
    pacVar2 = (char (*) [4])(this->min)._M_dataplus._M_p;
    local_40.pointer.length = (uint32_t)(this->min)._M_string_length;
    if (local_40.pointer.length < 0xd) {
      local_40._12_4_ = 0;
      local_40.pointer.prefix[0] = '\0';
      local_40.pointer.prefix[1] = '\0';
      local_40.pointer.prefix[2] = '\0';
      local_40.pointer.prefix[3] = '\0';
      local_40._8_4_ = 0;
      if (local_40.pointer.length != 0) {
        switchD_00b041bd::default
                  (local_40.pointer.prefix,pacVar2,(ulong)(local_40.pointer.length & 0xf));
      }
    }
    else {
      local_40.pointer.prefix = *pacVar2;
      local_40._8_4_ = SUB84(pacVar2,0);
      local_40._12_4_ = (undefined4)((ulong)pacVar2 >> 0x20);
    }
    bVar3 = string_t::StringComparisonOperators::GreaterThan((string_t *)&local_40.pointer,val);
    if (bVar3) goto LAB_010d192f;
  }
  else {
LAB_010d192f:
    uVar1 = (val->value).pointer.length;
    if ((ulong)uVar1 < 0x101) {
      if (uVar1 < 0xd) {
        pcVar5 = (val->value).pointer.prefix;
      }
      else {
        pcVar5 = (val->value).pointer.ptr;
      }
      local_40._0_8_ = &local_30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,pcVar5,pcVar5 + uVar1);
      ::std::__cxx11::string::operator=((string *)&this->min,(string *)&local_40.pointer);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._0_8_ != &local_30) {
        operator_delete((void *)local_40._0_8_);
      }
      bVar3 = false;
    }
    else {
      TruncateMin_abi_cxx11_((string *)&local_40.pointer,this,(string_t)(val->value).pointer,0x100);
      ::std::__cxx11::string::operator=((string *)&this->min,(string *)&local_40.pointer);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_40.pointer.prefix,local_40.pointer.length) != &local_30) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_40.pointer.prefix,local_40.pointer.length));
      }
      bVar3 = true;
    }
    this->min_truncated = bVar3;
  }
  if (this->has_stats == true) {
    pacVar2 = (char (*) [4])(this->max)._M_dataplus._M_p;
    local_40.pointer.length = (uint32_t)(this->max)._M_string_length;
    if (local_40.pointer.length < 0xd) {
      local_40._12_4_ = 0;
      local_40.pointer.prefix[0] = '\0';
      local_40.pointer.prefix[1] = '\0';
      local_40.pointer.prefix[2] = '\0';
      local_40.pointer.prefix[3] = '\0';
      local_40._8_4_ = 0;
      if (local_40.pointer.length != 0) {
        switchD_00b041bd::default
                  (local_40.pointer.prefix,pacVar2,(ulong)(local_40.pointer.length & 0xf));
      }
    }
    else {
      local_40.pointer.prefix = *pacVar2;
      local_40._8_4_ = SUB84(pacVar2,0);
      local_40._12_4_ = (undefined4)((ulong)pacVar2 >> 0x20);
    }
    bVar3 = string_t::StringComparisonOperators::GreaterThan(val,(string_t *)&local_40.pointer);
    if (!bVar3) goto LAB_010d1b1a;
  }
  uVar1 = (val->value).pointer.length;
  if ((ulong)uVar1 < 0x101) {
    if (uVar1 < 0xd) {
      pcVar5 = (val->value).pointer.prefix;
    }
    else {
      pcVar5 = (val->value).pointer.ptr;
    }
    local_40._0_8_ = &local_30;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,pcVar5,pcVar5 + uVar1);
    ::std::__cxx11::string::operator=((string *)&this->max,(string *)&local_40.pointer);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._0_8_ != &local_30) {
      operator_delete((void *)local_40._0_8_);
    }
    bVar3 = false;
  }
  else {
    bVar4 = TryTruncateMax(this,(string_t)(val->value).pointer,0x100,&this->max,
                           (this->type == BLOB) << 7 | 0x7f);
    bVar3 = true;
    if (!bVar4) {
      this->failed_truncate = true;
      this->has_stats = false;
      local_40._8_4_ = 0;
      local_40._12_4_ = 0;
      local_30._M_local_buf[0] = '\0';
      local_40._0_8_ = &local_30;
      ::std::__cxx11::string::operator=((string *)&this->min,(string *)&local_40.pointer);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._0_8_ != &local_30) {
        operator_delete((void *)local_40._0_8_);
      }
      local_40._8_4_ = 0;
      local_40._12_4_ = 0;
      local_30._M_local_buf[0] = '\0';
      local_40._0_8_ = &local_30;
      ::std::__cxx11::string::operator=((string *)&this->max,(string *)&local_40.pointer);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._0_8_ == &local_30) {
        return;
      }
      operator_delete((void *)local_40._0_8_);
      return;
    }
  }
  this->max_truncated = bVar3;
LAB_010d1b1a:
  this->has_stats = true;
  return;
}

Assistant:

void Update(const string_t &val) {
		if (failed_truncate) {
			return;
		}
		if (!has_stats || LessThan::Operation(val, string_t(min))) {
			if (val.GetSize() > MAX_STRING_STATISTICS_SIZE) {
				// string value exceeds our max string stats size - truncate
				min = TruncateMin(val, MAX_STRING_STATISTICS_SIZE);
				min_truncated = true;
			} else {
				min = val.GetString();
				min_truncated = false;
			}
		}
		if (!has_stats || GreaterThan::Operation(val, string_t(max))) {
			if (val.GetSize() > MAX_STRING_STATISTICS_SIZE) {
				// string value exceeds our max string stats size - truncate
				if (!TryTruncateMax(val, MAX_STRING_STATISTICS_SIZE, max)) {
					// we failed to truncate - this can happen in some edge cases
					// skip stats for this column
					failed_truncate = true;
					has_stats = false;
					min = string();
					max = string();
					return;
				}
				max_truncated = true;
			} else {
				max = val.GetString();
				max_truncated = false;
			}
		}
		has_stats = true;
	}